

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

ImGuiTableSettings * ImGui::TableGetBoundSettings(ImGuiTable *table)

{
  ImGuiTableSettings *pIVar1;
  long in_RDI;
  ImGuiTableSettings *settings;
  ImGuiContext *g;
  
  if (*(int *)(in_RDI + 0x6c) != -1) {
    pIVar1 = ImChunkStream<ImGuiTableSettings>::ptr_from_offset
                       (&GImGui->SettingsTables,*(int *)(in_RDI + 0x6c));
    if (*(int *)(in_RDI + 0x74) <= (int)pIVar1->ColumnsCountMax) {
      return pIVar1;
    }
    pIVar1->ID = 0;
  }
  return (ImGuiTableSettings *)0x0;
}

Assistant:

ImGuiTableSettings* ImGui::TableGetBoundSettings(ImGuiTable* table)
{
    if (table->SettingsOffset != -1)
    {
        ImGuiContext& g = *GImGui;
        ImGuiTableSettings* settings = g.SettingsTables.ptr_from_offset(table->SettingsOffset);
        IM_ASSERT(settings->ID == table->ID);
        if (settings->ColumnsCountMax >= table->ColumnsCount)
            return settings; // OK
        settings->ID = 0; // Invalidate storage, we won't fit because of a count change
    }
    return NULL;
}